

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O3

Vec_Int_t * Gia_ManProfileHash(Gia_Man_t *p,Vec_Int_t *vCode,Vec_Int_t *vCodeOffsets)

{
  Vec_Int_t *pVVar1;
  uint uVar2;
  int iVar3;
  Gia_Man_t *p_00;
  int *piVar4;
  Gia_Man_t *p_01;
  Vec_Int_t *pVVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  Gia_Man_t *p_02;
  int iVar9;
  
  iVar9 = p->nObjs;
  p_00 = (Gia_Man_t *)malloc(0x10);
  iVar3 = 0x10;
  if (0xe < iVar9 - 1U) {
    iVar3 = iVar9;
  }
  *(int *)((long)&p_00->pName + 4) = 0;
  *(int *)&p_00->pName = iVar3;
  if (iVar3 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar3 * 4);
  }
  p_00->pSpec = (char *)piVar4;
  p_01 = (Gia_Man_t *)calloc(1,0x28);
  uVar8 = iVar9 - 1U;
  while( true ) {
    do {
      uVar7 = uVar8;
      uVar8 = uVar7 + 1;
    } while ((uVar7 & 1) != 0);
    if (uVar8 < 9) break;
    iVar6 = 5;
    while (uVar8 % (iVar6 - 2U) != 0) {
      uVar2 = iVar6 * iVar6;
      iVar6 = iVar6 + 2;
      if (uVar8 < uVar2) goto LAB_006f66dc;
    }
  }
LAB_006f66dc:
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  uVar2 = uVar8;
  if (uVar7 < 0xf) {
    uVar2 = 0x10;
  }
  pVVar5->nCap = uVar2;
  piVar4 = (int *)malloc((long)(int)uVar2 << 2);
  pVVar5->pArray = piVar4;
  pVVar5->nSize = uVar8;
  memset(piVar4,0xff,(long)(int)uVar8 << 2);
  p_01->pName = (char *)pVVar5;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  iVar6 = iVar9 * 4;
  if (iVar9 * 4 - 1U < 0xf) {
    iVar6 = 0x10;
  }
  pVVar5->nSize = 0;
  pVVar5->nCap = iVar6;
  if (iVar6 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar6 << 2);
  }
  pVVar5->pArray = piVar4;
  p_01->pSpec = (char *)pVVar5;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  pVVar5->nSize = 0;
  pVVar5->nCap = iVar3;
  if (iVar3 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar3 << 2);
  }
  pVVar5->pArray = piVar4;
  *(Vec_Int_t **)&p_01->nRegs = pVVar5;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  pVVar5->nCap = 100;
  pVVar5->nSize = 0;
  piVar4 = (int *)malloc(400);
  pVVar5->pArray = piVar4;
  p_02 = p_01;
  Hsh_VecManAdd((Hsh_VecMan_t *)p_01,pVVar5);
  if (0 < p->nObjs) {
    iVar9 = 0;
    do {
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      Gia_ManProfileCollect(p_02,iVar9,vCode,vCodeOffsets,pVVar5);
      iVar3 = Hsh_VecManAdd((Hsh_VecMan_t *)p_01,pVVar5);
      p_02 = p_00;
      Vec_IntPush((Vec_Int_t *)p_00,iVar3);
      iVar9 = iVar9 + 1;
    } while (iVar9 < p->nObjs);
  }
  pVVar1 = (Vec_Int_t *)p_01->pName;
  piVar4 = pVVar1->pArray;
  if (piVar4 != (int *)0x0) {
    free(piVar4);
  }
  free(pVVar1);
  pVVar1 = (Vec_Int_t *)p_01->pSpec;
  piVar4 = pVVar1->pArray;
  if (piVar4 != (int *)0x0) {
    free(piVar4);
  }
  free(pVVar1);
  pVVar1 = *(Vec_Int_t **)&p_01->nRegs;
  piVar4 = pVVar1->pArray;
  if (piVar4 != (int *)0x0) {
    free(piVar4);
  }
  free(pVVar1);
  free(p_01);
  if (pVVar5->pArray != (int *)0x0) {
    free(pVVar5->pArray);
  }
  free(pVVar5);
  if (*(int *)((long)&p_00->pName + 4) == p->nObjs) {
    return (Vec_Int_t *)p_00;
  }
  __assert_fail("Vec_IntSize(vRes) == Gia_ManObjNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaMuxes.c"
                ,0x309,"Vec_Int_t *Gia_ManProfileHash(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *)");
}

Assistant:

Vec_Int_t * Gia_ManProfileHash( Gia_Man_t * p, Vec_Int_t * vCode, Vec_Int_t * vCodeOffsets )
{
    Hsh_VecMan_t * pHash;
    Vec_Int_t * vRes, * vArray;
    Gia_Obj_t * pObj;
    int i;
    vRes = Vec_IntAlloc( Gia_ManObjNum(p) );
    pHash = Hsh_VecManStart( Gia_ManObjNum(p) );
    // add empty entry
    vArray = Vec_IntAlloc( 100 );
    Hsh_VecManAdd( pHash, vArray );
    // iterate through the entries
    Gia_ManForEachObj( p, pObj, i )
    {
        Gia_ManProfileCollect( p, i, vCode, vCodeOffsets, vArray );
        Vec_IntPush( vRes, Hsh_VecManAdd( pHash, vArray ) );
    }
    Hsh_VecManStop( pHash );
    Vec_IntFree( vArray );
    assert( Vec_IntSize(vRes) == Gia_ManObjNum(p) );
    return vRes;
}